

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

pair<unsigned_int,_unsigned_int>
kratos::compute_var_high_low
          (Var *root,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *index)

{
  type_conflict1 tVar1;
  value_type vVar2;
  type_conflict1 tVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  size_type sVar7;
  reference pvVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  type_conflict1 *ptVar11;
  type_conflict1 *ptVar12;
  ulong uVar13;
  type *slice_low_1;
  type *slice_high_1;
  type *slice_low;
  type *slice_high;
  ulong local_70;
  uint64_t i;
  uint32_t index_to_size;
  uint32_t var_high;
  uint32_t var_low;
  int i_1;
  uint32_t base;
  allocator<unsigned_int> local_41;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> bases;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *var_sizes;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *index_local;
  Var *root_local;
  
  bases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)Var::size(root);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     bases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::allocator<unsigned_int>::allocator(&local_41);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,sVar7,&local_41);
  std::allocator<unsigned_int>::~allocator(&local_41);
  var_low = 1;
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     bases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  var_high = (uint32_t)sVar7;
  while (uVar5 = var_low, var_high = var_high - 1, -1 < (int)var_high) {
    uVar4 = Var::var_width(root);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                        (long)(int)var_high);
    *pvVar8 = uVar5 * uVar4;
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        bases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)var_high);
    var_low = *pvVar9 * var_low;
  }
  index_to_size = 0;
  i._4_4_ = 0;
  i._0_4_ = 0;
  for (local_70 = 0;
      sVar7 = std::
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::size(index), local_70 < sVar7; local_70 = local_70 + 1) {
    pvVar10 = std::
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::operator[](index,local_70);
    ptVar11 = std::get<0ul,unsigned_int,unsigned_int>(pvVar10);
    ptVar12 = std::get<1ul,unsigned_int,unsigned_int>(pvVar10);
    if (*ptVar12 < *ptVar11) {
      tVar1 = *ptVar12;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                          (ulong)(uint)i);
      vVar2 = *pvVar8;
      uVar5 = Var::var_width(root);
      uVar5 = index_to_size + tVar1 * vVar2 * uVar5;
      tVar1 = *ptVar11;
      tVar3 = *ptVar12;
      index_to_size = uVar5;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                          (ulong)(uint)i);
      vVar2 = *pvVar8;
      uVar4 = Var::var_width(root);
      iVar6 = uVar5 + ((tVar1 - tVar3) + 1) * vVar2 * uVar4;
    }
    else {
      if (((*ptVar11 != *ptVar12) ||
          (uVar13 = (ulong)(uint)i,
          sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             bases.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage), sVar7 <= uVar13))
         || (pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 bases.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)(uint)i),
            *pvVar9 < 2)) break;
      tVar1 = *ptVar12;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                          (ulong)(uint)i);
      uVar5 = tVar1 * *pvVar8 + index_to_size;
      tVar1 = *ptVar11;
      tVar3 = *ptVar12;
      index_to_size = uVar5;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                          (ulong)(uint)i);
      iVar6 = uVar5 + ((tVar1 - tVar3) + 1) * *pvVar8;
      i._0_4_ = (uint)i + 1;
    }
    i._4_4_ = iVar6 + -1;
  }
  sVar7 = std::
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ::size(index);
  if (local_70 < sVar7) {
    for (; sVar7 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::size(index), local_70 < sVar7; local_70 = local_70 + 1) {
      pvVar10 = std::
                vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ::operator[](index,local_70);
      ptVar11 = std::get<0ul,unsigned_int,unsigned_int>(pvVar10);
      ptVar12 = std::get<1ul,unsigned_int,unsigned_int>(pvVar10);
      index_to_size = *ptVar12 + index_to_size;
      i._4_4_ = index_to_size + (*ptVar11 - *ptVar12);
    }
  }
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
            ((pair<unsigned_int,_unsigned_int> *)&root_local,(uint *)((long)&i + 4),&index_to_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return (pair<unsigned_int,_unsigned_int>)root_local;
}

Assistant:

std::pair<uint32_t, uint32_t> compute_var_high_low(
    const Var *root, const std::vector<std::pair<uint32_t, uint32_t>> &index) {
    // outer to inner
    // flatten the index
    auto const &var_sizes = root->size();
    std::vector<uint32_t> bases(var_sizes.size());
    uint32_t base = 1;
    for (int i = static_cast<int>(var_sizes.size()) - 1; i >= 0; i--) {
        bases[i] = base * root->var_width();
        base *= var_sizes[i];
    }

    uint32_t var_low = 0;
    uint32_t var_high = 0;
    uint32_t index_to_size = 0;
    uint64_t i = 0;
    while (i < index.size()) {
        auto const &[slice_high, slice_low] = index[i];
        if (slice_high > slice_low) {
            var_low += slice_low * bases[index_to_size] * root->var_width();
            var_high = var_low +
                       (slice_high - slice_low + 1) * bases[index_to_size] * root->var_width() - 1;
        } else if (slice_high == slice_low && index_to_size < var_sizes.size() &&
                   var_sizes[index_to_size] > 1) {
            var_low += slice_low * bases[index_to_size];
            var_high = var_low + (slice_high - slice_low + 1) * bases[index_to_size] - 1;
            index_to_size++;
        } else {
            break;
        }
        i++;
    }

    if (i < index.size()) {
        for (; i < index.size(); i++) {
            auto const &[slice_high, slice_low] = index[i];
            var_low += slice_low;
            var_high = var_low + (slice_high - slice_low);
        }
    }

    return {var_high, var_low};
}